

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneBoxOneFuncOnce.c
# Opt level: O0

void SystemPause(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_48 [8];
  termios old;
  char buf;
  
  printf("press any key to exit...");
  old.c_ispeed._3_1_ = 0;
  memset(local_48,0,0x3c);
  fflush(_stdout);
  iVar1 = tcgetattr(0,(termios *)local_48);
  if (iVar1 < 0) {
    perror("tcsetattr()");
  }
  old.c_oflag = old.c_oflag & 0xfffffff5;
  old.c_lflag._3_1_ = 1;
  old.c_lflag._2_1_ = 0;
  iVar1 = tcsetattr(0,0,(termios *)local_48);
  if (iVar1 < 0) {
    perror("tcsetattr ICANON");
  }
  sVar2 = read(0,(void *)((long)&old.c_ispeed + 3),1);
  if (sVar2 < 0) {
    perror("read()");
  }
  old.c_oflag = old.c_oflag | 10;
  iVar1 = tcsetattr(0,1,(termios *)local_48);
  if (iVar1 < 0) {
    perror("tcsetattr ~ICANON");
  }
  printf("\n");
  return;
}

Assistant:

void SystemPause(void)
{
    printf("press any key to exit...");
    char buf = 0;
    struct termios old = {0};
    fflush(stdout);
    if (tcgetattr(0, &old) < 0)
        perror("tcsetattr()");
    old.c_lflag &= ~ICANON;
    old.c_lflag &= ~ECHO;
    old.c_cc[VMIN] = 1;
    old.c_cc[VTIME] = 0;
    if (tcsetattr(0, TCSANOW, &old) < 0)
        perror("tcsetattr ICANON");
    if (read(0, &buf, 1) < 0)
        perror("read()");
    old.c_lflag |= ICANON;
    old.c_lflag |= ECHO;
    if (tcsetattr(0, TCSADRAIN, &old) < 0)
        perror("tcsetattr ~ICANON");
    printf("\n");
}